

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  vector<long,std::allocator<long>> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  long *plVar3;
  unsigned_long *puVar4;
  unsigned_long index;
  FILE *__stream;
  pointer pbVar5;
  pointer ppVVar6;
  pointer pvVar7;
  uint uVar8;
  int iVar9;
  ostream *poVar10;
  sequence_gap_structure *sequence_descriptor1;
  char *pcVar11;
  Vector *pVVar12;
  char *s2;
  long lVar13;
  sequence_gap_structure *psVar14;
  ulong uVar15;
  char matchMode;
  int iVar16;
  unsigned_long sid;
  pointer index_00;
  ulong __val;
  unsigned_long *puVar17;
  bool bVar18;
  ulong idx;
  uint __len;
  long *plVar19;
  type value;
  pointer ppVVar20;
  ulong uVar21;
  pointer pbVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  pair<std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>,_bool> pVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  pVar28;
  char automatonState;
  Vector *local_210;
  pointer local_208;
  string __str;
  Vector *differences;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long firstSequenceLength;
  args_t args;
  vector<long,_std::allocator<long>_> assignments;
  long my_code;
  pointer pbStack_150;
  pointer local_148;
  vector<Vector_*,_std::allocator<Vector_*>_> patterns;
  vector<long,_std::allocator<long>_> recoded;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  copies;
  time_t after;
  time_t before;
  vector<long,_std::allocator<long>_> new_vector;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  recoded_patterns;
  map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
  pattern_map;
  
  argparse::args_t::args_t(&args,argc,argv);
  firstSequenceLength = 0;
  automatonState = '\0';
  Vector::appendValue(&nameLengths,0);
  Vector::appendValue(&seqLengths,0);
  initAlphabets(false,(char *)0x0,false);
  iVar9 = readFASTA(args.reference,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                    &firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
  iVar16 = 1;
  if (iVar9 != 1) {
    automatonState = '\0';
    iVar9 = readFASTA(args.input,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,false,(Vector *)0x0,':',1.0,(bool)(args.quiet ^ 1));
    if (iVar9 != 1) {
      local_208 = (pointer)seqLengths.vLength;
      if (args.quiet == false) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read ",5);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," sequences of length ",0x15);
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"nt from input file ",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      pcVar1 = (pointer)((long)local_208 - 1);
      sequence_descriptor1 =
           (sequence_gap_structure *)
           operator_new__(-(ulong)((ulong)pcVar1 >> 0x3b != 0) | (long)pcVar1 * 0x20);
      if (pcVar1 != (pointer)0x0) {
        psVar14 = sequence_descriptor1;
        do {
          psVar14->first_nongap = 0x7fffffffffffffff;
          psVar14->last_nongap = 0;
          psVar14->resolved_start = 0;
          psVar14->resolved_end = 0;
          psVar14 = psVar14 + 1;
        } while (psVar14 != sequence_descriptor1 + (long)pcVar1);
        index_00 = (pointer)0x0;
        psVar14 = sequence_descriptor1;
        do {
          pcVar11 = stringText(&sequences,&seqLengths,(unsigned_long)index_00);
          describe_sequence((sequence_gap_structure *)&pattern_map,pcVar11,firstSequenceLength,4);
          psVar14->resolved_start =
               (long)pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          psVar14->resolved_end =
               (long)pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          psVar14->first_nongap = pattern_map._M_t._M_impl._0_8_;
          psVar14->last_nongap =
               CONCAT44(pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
          index_00 = index_00 + 1;
          psVar14 = psVar14 + 1;
        } while (pcVar1 != index_00);
      }
      if (args.quiet == false) {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
        std::ostream::put('P');
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Progress: ",10);
      }
      matchMode = '\x06';
      if (args.ambig != informative) {
        matchMode = (args.ambig == all) * '\x05';
      }
      time(&before);
      stringText(&names,&nameLengths,0);
      pcVar11 = stringText(&sequences,&seqLengths,0);
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &pattern_map._M_t._M_impl.super__Rb_tree_header._M_header;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      copies.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      copies.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      copies.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __str._M_dataplus._M_p = (pointer)0x1;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pointer)0x1 < pcVar1) {
        auVar25._8_4_ = (int)((ulong)pcVar1 >> 0x20);
        auVar25._0_8_ = pcVar1;
        auVar25._12_4_ = 0x45300000;
        dVar26 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)pcVar1) - 4503599627370496.0);
        local_208 = (pointer)((long)local_208 + -2);
        local_210 = (Vector *)0x0;
        do {
          if ((args.quiet == false) &&
             (((pointer)__str._M_dataplus._M_p == local_208 ||
              (0.1 < ((double)(long)__str._M_dataplus._M_p * 100.0) / dVar26 - (double)local_210))))
          {
            time(&after);
            local_210 = (Vector *)((double)(long)__str._M_dataplus._M_p * 100.0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                       ,0x5f);
            local_210 = (Vector *)((double)local_210 / dVar26);
            *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
            poVar10 = std::ostream::_M_insert<double>((double)local_210);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"% (",3);
            lVar13 = *(long *)poVar10;
            *(undefined8 *)(poVar10 + *(long *)(lVar13 + -0x18) + 0x10) = 0xc;
            *(undefined8 *)(poVar10 + *(long *)(lVar13 + -0x18) + 8) = 3;
            dVar23 = (double)(long)__str._M_dataplus._M_p;
            dVar24 = difftime(after,before);
            poVar10 = std::ostream::_M_insert<double>(dVar23 / dVar24);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," seqs/sec)",10);
            after = before;
          }
          pVVar12 = (Vector *)operator_new(0x18);
          Vector::Vector(pVVar12);
          differences = pVVar12;
          s2 = stringText(&sequences,&seqLengths,(unsigned_long)__str._M_dataplus._M_p);
          computeDifferences(pcVar11,s2,firstSequenceLength,matchMode,differences,
                             sequence_descriptor1,
                             sequence_descriptor1 + (long)__str._M_dataplus._M_p);
          new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)differences;
          new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)pattern_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
          pVar27 = std::
                   _Rb_tree<Vector*,std::pair<Vector*const,long>,std::_Select1st<std::pair<Vector*const,long>>,cmpMatchPatterns,std::allocator<std::pair<Vector*const,long>>>
                   ::_M_insert_unique<std::pair<Vector*const,long>>
                             ((_Rb_tree<Vector*,std::pair<Vector*const,long>,std::_Select1st<std::pair<Vector*const,long>>,cmpMatchPatterns,std::allocator<std::pair<Vector*const,long>>>
                               *)&pattern_map,(pair<Vector_*const,_long> *)&new_vector);
          if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            my_code = (long)pVar27.first._M_node._M_node[1]._M_parent;
            if (assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&assignments,
                         (iterator)
                         assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,&my_code);
            }
            else {
              *assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = my_code;
              assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pVVar12 = differences;
            if (differences != (Vector *)0x0) {
              Vector::~Vector(differences);
              operator_delete(pVVar12,0x18);
            }
          }
          else {
            my_code = pattern_map._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
            new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)my_code;
            if (assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&assignments,
                         (iterator)
                         assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long *)&new_vector);
            }
            else {
              *assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = my_code;
              assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Vector*,std::allocator<Vector*>>::_M_realloc_insert<Vector*const&>
                        ((vector<Vector*,std::allocator<Vector*>> *)&patterns,
                         (iterator)
                         patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&differences);
            }
            else {
              *patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
               super__Vector_impl_data._M_finish = differences;
              patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          if ((ulong)(((long)copies.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)copies.
                             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              <= (ulong)my_code) {
            new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::push_back(&copies,(value_type *)&new_vector);
            if (new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)new_vector.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)new_vector.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          this = (vector<long,std::allocator<long>> *)
                 (copies.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + my_code);
          __position._M_current = *(long **)(this + 8);
          if (__position._M_current == *(long **)(this + 0x10)) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      (this,__position,(long *)&__str);
          }
          else {
            *__position._M_current = (long)__str._M_dataplus._M_p;
            *(long **)(this + 8) = __position._M_current + 1;
          }
          __str._M_dataplus._M_p = __str._M_dataplus._M_p + 1;
        } while (__str._M_dataplus._M_p < pcVar1);
      }
      ppVVar6 = patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((args.out_format == json) && (args.compress == true)) {
        new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)new_vector.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000)
        ;
        new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_148 = (pointer)0x0;
        my_code = 0;
        pbStack_150 = (pointer)0x0;
        recoded_patterns.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        recoded_patterns.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        recoded_patterns.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          paVar2 = &__str.field_2;
          ppVVar20 = patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          do {
            recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_208 = ppVVar20;
            if ((*ppVVar20)->vLength != 0) {
              idx = 0;
              local_210 = *ppVVar20;
              do {
                differences = (Vector *)&local_1c8;
                local_1d0 = 0;
                local_1c8._M_local_buf[0] = '\0';
                lVar13 = Vector::value(local_210,idx);
                uVar21 = (lVar13 >> 8) + 1;
                __val = -uVar21;
                if (0 < (long)uVar21) {
                  __val = uVar21;
                }
                __len = 1;
                if (9 < __val) {
                  uVar15 = __val;
                  uVar8 = 4;
                  do {
                    __len = uVar8;
                    if (uVar15 < 100) {
                      __len = __len - 2;
                      goto LAB_001060eb;
                    }
                    if (uVar15 < 1000) {
                      __len = __len - 1;
                      goto LAB_001060eb;
                    }
                    if (uVar15 < 10000) goto LAB_001060eb;
                    bVar18 = 99999 < uVar15;
                    uVar15 = uVar15 / 10000;
                    uVar8 = __len + 4;
                  } while (bVar18);
                  __len = __len + 1;
                }
LAB_001060eb:
                __str._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct
                          ((ulong)&__str,(char)__len - (char)((long)uVar21 >> 0x3f));
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (__str._M_dataplus._M_p + -((long)uVar21 >> 0x3f),__len,__val);
                std::__cxx11::string::_M_append((char *)&differences,(ulong)__str._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != paVar2) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                unmap_char((uchar)lVar13,false);
                std::__cxx11::string::push_back((char)&differences);
                __str._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&__str,differences,(long)&differences->vData + local_1d0);
                pVar28 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                         ::_M_insert_unique<std::pair<std::__cxx11::string_const,long>>
                                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                                     *)&new_vector,
                                    (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                                     *)&__str);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != paVar2) {
                  operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
                }
                if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  __str._M_dataplus._M_p = *(pointer *)(pVar28.first._M_node._M_node + 2);
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&my_code,(value_type *)&differences);
                  __str._M_dataplus._M_p = (pointer)0xffffffffffffffff;
                }
                if (recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            ((vector<long,std::allocator<long>> *)&recoded,
                             (iterator)
                             recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish,(long *)&__str);
                }
                else {
                  *recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish = (long)__str._M_dataplus._M_p;
                  recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)differences != &local_1c8) {
                  operator_delete(differences,
                                  CONCAT71(local_1c8._M_allocated_capacity._1_7_,
                                           local_1c8._M_local_buf[0]) + 1);
                }
                idx = idx + 1;
              } while (idx < local_210->vLength);
            }
            std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::push_back(&recoded_patterns,&recoded);
            ppVVar20 = local_208;
            if (recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            ppVVar20 = ppVVar20 + 1;
          } while (ppVVar20 != ppVVar6);
        }
        fwrite("{\"reference\":\"",0xe,1,(FILE *)args.output);
        dump_fasta(pcVar11,firstSequenceLength,args.output,false,false,0,0);
        fwrite("\",\"mutations\" : [",0x11,1,(FILE *)args.output);
        lVar13 = my_code;
        fprintf((FILE *)args.output,"\"%s\"",*(undefined8 *)my_code);
        pbVar5 = pbStack_150;
        for (pbVar22 = (pointer)(lVar13 + 0x20); pbVar22 != pbVar5; pbVar22 = pbVar22 + 1) {
          fprintf((FILE *)args.output,",\"%s\"",(pbVar22->_M_dataplus)._M_p);
        }
        fwrite("], \"patterns\" : [",0x11,1,(FILE *)args.output);
        local_210 = (Vector *)
                    recoded_patterns.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (recoded_patterns.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            recoded_patterns.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar18 = false;
          pVVar12 = (Vector *)
                    recoded_patterns.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (bVar18) {
              fputc(0x2c,(FILE *)args.output);
            }
            fputc(0x5b,(FILE *)args.output);
            plVar19 = pVVar12->vData;
            plVar3 = (long *)pVVar12->vLength;
            if (plVar19 != plVar3) {
              bVar18 = true;
              do {
                lVar13 = *plVar19;
                if (!bVar18) {
                  fputc(0x2c,(FILE *)args.output);
                }
                bVar18 = false;
                fprintf((FILE *)args.output,"%ld",lVar13);
                plVar19 = plVar19 + 1;
              } while (plVar19 != plVar3);
            }
            fputc(0x5d,(FILE *)args.output);
            pVVar12 = pVVar12 + 1;
            bVar18 = true;
          } while (pVVar12 != local_210);
        }
        fwrite("], \"sequences\" : [",0x12,1,(FILE *)args.output);
        pvVar7 = copies.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (copies.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            copies.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar18 = false;
          pVVar12 = (Vector *)
                    copies.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (bVar18) {
              fputc(0x2c,(FILE *)args.output);
            }
            fputc(0x5b,(FILE *)args.output);
            puVar17 = (unsigned_long *)pVVar12->vData;
            puVar4 = (unsigned_long *)pVVar12->vLength;
            local_210 = pVVar12;
            if (puVar17 != puVar4) {
              bVar18 = true;
              do {
                index = *puVar17;
                if (!bVar18) {
                  fputc(0x2c,(FILE *)args.output);
                }
                __stream = args.output;
                pcVar11 = stringText(&names,&nameLengths,index);
                bVar18 = false;
                fprintf((FILE *)__stream,"\"%s\"",pcVar11);
                puVar17 = puVar17 + 1;
              } while (puVar17 != puVar4);
            }
            fputc(0x5d,(FILE *)args.output);
            pVVar12 = local_210 + 1;
            bVar18 = true;
          } while (pVVar12 != (Vector *)pvVar7);
        }
        fwrite("]}",2,1,(FILE *)args.output);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&recoded_patterns);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&my_code);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&new_vector);
      }
      operator_delete__(sequence_descriptor1);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&copies);
      if (patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<Vector_*,_std::pair<Vector_*const,_long>,_std::_Select1st<std::pair<Vector_*const,_long>_>,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
      ::~_Rb_tree(&pattern_map._M_t);
      iVar16 = 0;
    }
  }
  argparse::args_t::~args_t(&args);
  return iVar16;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args = args_t(argc, argv);

  long firstSequenceLength = 0;

  char automatonState = 0;
  // 0 - between sequences
  // 1 - reading sequence name
  // 2 - reading sequence

  nameLengths.appendValue(0);
  seqLengths.appendValue(0);

  initAlphabets(false, NULL);
  if (readFASTA(args.reference, automatonState, names, sequences, nameLengths,
                  seqLengths, firstSequenceLength) == 1)
    return 1;
    
  automatonState = 0;
    
    
  if (readFASTA(args.input, automatonState, names, sequences, nameLengths,
                seqLengths, firstSequenceLength, false, NULL, ':', 1.0, !args.quiet) == 1)
    return 1;

  unsigned long sequenceCount = seqLengths.length() - 1;

  if (!args.quiet) {
      cerr << "Read " << sequenceCount - 1 << " sequences of length " << firstSequenceLength <<"nt from input file " << endl;
  }

  sequence_gap_structure *sequence_descriptors = NULL;

  double percentDone = 0.;

  sequence_descriptors = new sequence_gap_structure[sequenceCount];
  for (unsigned long sid = 0UL; sid < sequenceCount; sid++) {
    sequence_descriptors[sid] = describe_sequence(
        stringText(sequences, seqLengths, sid), firstSequenceLength);
  }

  if (!args.quiet)
    cerr << endl << "Progress: ";

  int resolutionOption;
  switch (args.ambig) {
  case resolve:
    resolutionOption = RESOLVE;
    break;
  case all:
    resolutionOption = MISMATCH;
    break;
  case informative:
    resolutionOption = INFORMATIVE;
    break;
  }

  time_t before, after;
  time(&before);

  const char *ref_name = stringText(names, nameLengths, 0),
             *ref_seq = stringText(sequences, seqLengths, 0);
    
  const sequence_gap_structure *ref_gaps = &sequence_descriptors[0];
    
  std::map <Vector*, long, cmpMatchPatterns> pattern_map;
  std::vector <long> assignments;
  std::vector <Vector*> patterns;
  std::vector <std::vector<long>> copies;
    
    
  for (long seq_id = 1L; seq_id < sequenceCount; seq_id ++) {
      
      if (!args.quiet && (seq_id * 100. / sequenceCount - percentDone > 0.1 ||
                          seq_id == (long)sequenceCount - 1)) {
        {
          time(&after);
          percentDone = seq_id * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                  ":"
               << setw(8) << percentDone << "% (" << setw(12) << std::setprecision(3)
               << seq_id / difftime(after, before) << " seqs/sec)";

          after = before;
        }
      }
      
      Vector* differences = new Vector;
      const char *seq_data = stringText(sequences, seqLengths, seq_id);

      computeDifferences(ref_seq, seq_data, firstSequenceLength, resolutionOption, *differences, ref_gaps, &sequence_descriptors[seq_id]);
      
      auto intert_result = pattern_map.insert({differences, pattern_map.size()});
      bool did_insert = std::get<1>(intert_result);
      long my_code;
      if (!did_insert) {
          auto value = std::get<0>(intert_result);
          my_code = std::get<1>(*value);
          assignments.push_back(my_code);
          delete differences;
      } else {
          my_code = pattern_map.size()-1;
          assignments.push_back(pattern_map.size()-1);
          patterns.push_back (differences);
      }
      if (my_code >= copies.size()) {
          std::vector<long> new_vector;
          copies.push_back (new_vector);
      }
      copies[my_code].push_back(seq_id);
  }
    
  
    
  if (args.out_format == json) {
      if (args.compress) {
          std::map <std::string, long> differences_map;
          std::vector <std::string> unique_differences;
          std::vector <std::vector<long>> recoded_patterns;
          
          for (Vector* p : patterns) {
              std::vector <long> recoded;
              for (long i = 0; i < p->length(); i++) {
                  std::string mut;
                  long     position;
                  unsigned character;
                  unpack_difference(p->value (i), position, character);
                  mut += to_string(position+1);
                  mut += unmap_char(character);
                  auto intert_result = differences_map.insert({mut, differences_map.size()});
                  bool did_insert = std::get<1>(intert_result);
                  long index;
                  if (did_insert) {
                      unique_differences.push_back (mut);
                      //cout << mut << endl;
                      index = differences_map.size() - 1;
                  } else {
                      auto value = std::get<0>(intert_result);
                      index = std::get<1>(*value);
                  }
                  recoded.push_back (index);
              }
              recoded_patterns.push_back (recoded);
          }
          
          // write out mutational codes
          fprintf (args.output, "{\"reference\":\"");
          dump_fasta (ref_seq, firstSequenceLength, args.output, false, false,0L,0L);
          fprintf (args.output, "\",\"mutations\" : [");
          auto mutation_string = unique_differences.begin();
          fprintf (args.output, "\"%s\"", (*mutation_string).c_str());
          mutation_string ++;
          std::for_each(mutation_string, unique_differences.end(), [&](const std::string& s) {fprintf (args.output,",\"%s\"",s.c_str()); });
          fprintf (args.output, "], \"patterns\" : [");
          bool comma = false;
          std::for_each(recoded_patterns.begin(), recoded_patterns.end(),[&](const std::vector<long>& pattern) {
              if (comma) fprintf (args.output, ",");
              long comma_inner = false;
              fprintf (args.output, "[");
              std::for_each(pattern.begin(), pattern.end(), [&](const long mi) {
                  if (comma_inner) fprintf (args.output, ",");
                  fprintf (args.output, "%ld", mi);
                  comma_inner = true;
              });
              fprintf (args.output, "]");
              comma = true;
          });
          fprintf (args.output, "], \"sequences\" : [");
          comma = false;
          std::for_each(copies.begin(), copies.end(),[&](const std::vector<long>& pattern) {
              if (comma) fprintf (args.output, ",");
              long comma_inner = false;
              fprintf (args.output, "[");
              std::for_each(pattern.begin(), pattern.end(), [&](const long mi) {
                  if (comma_inner) fprintf (args.output, ",");
                  fprintf (args.output, "\"%s\"", stringText(names, nameLengths, mi));
                  comma_inner = true;
              });
              fprintf (args.output, "]");
              comma = true;
          });
          fprintf (args.output, "]}");
      }
      
      /*for (std::vector<long> c: copies ) {
          cout << c.size() << endl;
      }*/
      
      
  }
    
  delete [] sequence_descriptors;
  return 0;
}